

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dp.c
# Opt level: O3

char * LoadTimeStep(MpiStreamWR Stream,size_t TimeStep)

{
  pthread_rwlock_t *__rwlock;
  _TimeStepsEntry *p_Var1;
  
  __rwlock = &Stream->LockTS;
  pthread_rwlock_rdlock((pthread_rwlock_t *)__rwlock);
  p_Var1 = (Stream->TimeSteps).stqh_first;
  while( true ) {
    if (p_Var1 == (_TimeStepsEntry *)0x0) {
      pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
      return (char *)0x0;
    }
    if (p_Var1->TimeStep == TimeStep) break;
    p_Var1 = (p_Var1->entries).stqe_next;
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  if (p_Var1->Data == (_SstData *)0x0) {
    return (char *)0x0;
  }
  return p_Var1->Data->block;
}

Assistant:

static char *LoadTimeStep(MpiStreamWR Stream, size_t TimeStep)
{
    TimeStepsEntry Entry = NULL;
    char *Data = NULL;

    pthread_rwlock_rdlock(&Stream->LockTS);
    STAILQ_FOREACH(Entry, &Stream->TimeSteps, entries)
    {
        if (Entry->TimeStep == TimeStep)
        {
            break;
        }
    }
    pthread_rwlock_unlock(&Stream->LockTS);

    if (Entry && Entry->Data)
    {
        Data = Entry->Data->block;
    }

    return Data;
}